

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.h
# Opt level: O0

GeneralNode * __thiscall GraphBuilder::addNode<GeneralNode>(GraphBuilder *this,GeneralNode *node)

{
  bool bVar1;
  Node *in_RSI;
  GeneralNode **in_RDI;
  pair<std::__detail::_Node_iterator<Node_*,_true,_false>,_bool> pVar2;
  value_type *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa1;
  Node *local_8;
  
  bVar1 = Node::isArtificial(in_RSI);
  if (bVar1) {
    pVar2 = std::
            unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
            ::insert((unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
                      *)CONCAT71(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
  }
  else {
    Node::llvmInstruction(in_RSI);
    pVar2 = (pair<std::__detail::_Node_iterator<Node_*,_true,_false>,_bool>)
            std::
            unordered_map<llvm::Instruction_const*,Node*,std::hash<llvm::Instruction_const*>,std::equal_to<llvm::Instruction_const*>,std::allocator<std::pair<llvm::Instruction_const*const,Node*>>>
            ::emplace<llvm::Instruction_const*,GeneralNode*&>
                      ((unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
                        *)CONCAT71(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0),
                       (Instruction **)in_stack_ffffffffffffff98,in_RDI);
  }
  local_8 = in_RSI;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_8 = (Node *)0x0;
  }
  return (GeneralNode *)local_8;
}

Assistant:

T *addNode(T *node) {
        if (node->isArtificial()) {
            if (this->artificialNodes_.insert(node).second) {
                return node;
            }
        } else {
            if (this->llvmToNodeMap_.emplace(node->llvmInstruction(), node)
                        .second) {
                return node;
            }
        }
        return nullptr;
    }